

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

void __thiscall Matrix3f::transpose(Matrix3f *this)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  undefined4 local_1c;
  undefined4 local_18;
  int j;
  int i;
  float temp;
  Matrix3f *this_local;
  
  for (local_18 = 0; local_1c = local_18, local_18 < 2; local_18 = local_18 + 1) {
    while (local_1c = local_1c + 1, local_1c < 3) {
      pfVar3 = operator()(this,local_18,local_1c);
      fVar1 = *pfVar3;
      pfVar3 = operator()(this,local_1c,local_18);
      fVar2 = *pfVar3;
      pfVar3 = operator()(this,local_18,local_1c);
      *pfVar3 = fVar2;
      pfVar3 = operator()(this,local_1c,local_18);
      *pfVar3 = fVar1;
    }
  }
  return;
}

Assistant:

void Matrix3f::transpose()
{
	float temp;

	for( int i = 0; i < 2; ++i )
	{
		for( int j = i + 1; j < 3; ++j )
		{
			temp = ( *this )( i, j );
			( *this )( i, j ) = ( *this )( j, i );
			( *this )( j, i ) = temp;
		}
	}
}